

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_fseek.c
# Opt level: O2

zip_int8_t zip_fseek(zip_file_t *zf,zip_int64_t offset,int whence)

{
  int iVar1;
  zip_int8_t zVar2;
  
  zVar2 = -1;
  if ((zf != (zip_file_t *)0x0) && ((zf->error).zip_err == 0)) {
    iVar1 = zip_source_seek(zf->src,offset,whence);
    if (iVar1 < 0) {
      _zip_error_set_from_source(&zf->error,zf->src);
    }
    else {
      zVar2 = '\0';
    }
  }
  return zVar2;
}

Assistant:

ZIP_EXTERN zip_int8_t
zip_fseek(zip_file_t *zf, zip_int64_t offset, int whence) {
    if (!zf)
	return -1;

    if (zf->error.zip_err != 0)
	return -1;

    if (zip_source_seek(zf->src, offset, whence) < 0) {
	_zip_error_set_from_source(&zf->error, zf->src);
	return -1;
    }

    return 0;
}